

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

DynamicEntryList * __thiscall
cmELFInternalImpl<cmELFTypes32>::GetDynamicEntries
          (DynamicEntryList *__return_storage_ptr__,cmELFInternalImpl<cmELFTypes32> *this)

{
  bool bVar1;
  size_type __n;
  reference __args;
  ELF_Dyn *dyn;
  iterator __end0;
  iterator __begin0;
  vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_> *__range1;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  DynamicEntryList *result;
  
  std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
  vector(__return_storage_ptr__);
  bVar1 = LoadDynamicSection(this);
  if (bVar1) {
    __n = std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::size(&this->DynamicSectionEntries);
    std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
    reserve(__return_storage_ptr__,__n);
    __end0 = std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::begin(&this->DynamicSectionEntries)
    ;
    dyn = (ELF_Dyn *)
          std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::end(&this->DynamicSectionEntries);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<Elf32_Dyn_*,_std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>_>
                                       *)&dyn), bVar1) {
      __args = __gnu_cxx::
               __normal_iterator<Elf32_Dyn_*,_std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>_>::
               operator*(&__end0);
      std::vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>::
      emplace_back<int&,unsigned_int&>
                ((vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>
                  *)__return_storage_ptr__,&__args->d_tag,&(__args->d_un).d_val);
      __gnu_cxx::__normal_iterator<Elf32_Dyn_*,_std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>_>
      ::operator++(&__end0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmELF::DynamicEntryList cmELFInternalImpl<Types>::GetDynamicEntries()
{
  cmELF::DynamicEntryList result;

  // Ensure entries have been read from file
  if (!this->LoadDynamicSection()) {
    return result;
  }

  // Copy into public array
  result.reserve(this->DynamicSectionEntries.size());
  for (ELF_Dyn& dyn : this->DynamicSectionEntries) {
    result.emplace_back(dyn.d_tag, dyn.d_un.d_val);
  }

  return result;
}